

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDsd.c
# Opt level: O0

void Abc_NodeDecompDsdAndMux
               (Abc_Obj_t *pNode,Vec_Ptr_t *vNodes,Dsd_Manager_t *pManDsd,int fRecursive,
               int *pCounters)

{
  Abc_Obj_t *dd_00;
  int iVar1;
  int iVar2;
  Dsd_Node_t *pDVar3;
  DdNode *pDVar4;
  int fCompl;
  int iVar;
  int nNodesDsd;
  int i;
  Dsd_Node_t *pFaninDsd;
  Dsd_Node_t *pNodeDsd;
  Dsd_Node_t **ppNodesDsd;
  Abc_Obj_t *pNodeC;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pRoot;
  DdManager *dd;
  int *pCounters_local;
  Dsd_Manager_t *pDStack_20;
  int fRecursive_local;
  Dsd_Manager_t *pManDsd_local;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pNode_local;
  
  pRoot = (Abc_Obj_t *)pNode->pNtk->pManFunc;
  pFanin = (Abc_Obj_t *)0x0;
  dd = (DdManager *)pCounters;
  pCounters_local._4_4_ = fRecursive;
  pDStack_20 = pManDsd;
  pManDsd_local = (Dsd_Manager_t *)vNodes;
  vNodes_local = (Vec_Ptr_t *)pNode;
  pDVar3 = Dsd_DecomposeOne(pManDsd,(DdNode *)(pNode->field_5).pData);
  pFaninDsd = (Dsd_Node_t *)((ulong)pDVar3 & 0xfffffffffffffffe);
  if (pCounters_local._4_4_ != 0) {
    iVar1 = Dsd_NodeReadDecsNum(pFaninDsd);
    iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)vNodes_local);
    dd_00 = pRoot;
    if (iVar1 == iVar2) {
      pDVar4 = (DdNode *)vNodes_local[3].pArray;
      iVar1 = Abc_ObjFaninNum((Abc_Obj_t *)vNodes_local);
      iVar1 = Abc_NodeFindMuxVar((DdManager *)dd_00,pDVar4,iVar1);
      ppNodesDsd = (Dsd_Node_t **)Abc_ObjFanin((Abc_Obj_t *)vNodes_local,iVar1);
      pNode2 = Abc_NtkCloneObj((Abc_Obj_t *)vNodes_local);
      pDVar4 = Cudd_Cofactor((DdManager *)pRoot,(DdNode *)vNodes_local[3].pArray,
                             (DdNode *)
                             (*(ulong *)((long)pRoot[4].field_5.pData + (long)iVar1 * 8) ^ 1));
      (pNode2->field_5).pData = pDVar4;
      Cudd_Ref((DdNode *)(pNode2->field_5).pData);
      Abc_NodeMinimumBase(pNode2);
      iVar2 = Abc_NodeIsForDsd(pNode2);
      if (iVar2 != 0) {
        Vec_PtrPush((Vec_Ptr_t *)pManDsd_local,pNode2);
      }
      pNodeC = Abc_NtkCloneObj((Abc_Obj_t *)vNodes_local);
      pDVar4 = Cudd_Cofactor((DdManager *)pRoot,(DdNode *)vNodes_local[3].pArray,
                             *(DdNode **)((long)pRoot[4].field_5.pData + (long)iVar1 * 8));
      (pNodeC->field_5).pData = pDVar4;
      Cudd_Ref((DdNode *)(pNodeC->field_5).pData);
      Abc_NodeMinimumBase(pNodeC);
      iVar1 = Abc_NodeIsForDsd(pNodeC);
      if (iVar1 != 0) {
        Vec_PtrPush((Vec_Ptr_t *)pManDsd_local,pNodeC);
      }
      Abc_ObjRemoveFanins((Abc_Obj_t *)vNodes_local);
      Abc_ObjAddFanin((Abc_Obj_t *)vNodes_local,(Abc_Obj_t *)ppNodesDsd);
      Abc_ObjAddFanin((Abc_Obj_t *)vNodes_local,pNodeC);
      Abc_ObjAddFanin((Abc_Obj_t *)vNodes_local,pNode2);
      Cudd_RecursiveDeref((DdManager *)pRoot,(DdNode *)vNodes_local[3].pArray);
      pDVar4 = Cudd_bddIte((DdManager *)pRoot,*pRoot[4].field_5.pData,
                           *(DdNode **)((long)pRoot[4].field_5.pData + 8),
                           *(DdNode **)((long)pRoot[4].field_5.pData + 0x10));
      vNodes_local[3].pArray = (void **)pDVar4;
      Cudd_Ref((DdNode *)vNodes_local[3].pArray);
      return;
    }
  }
  for (iVar = 0; iVar1 = iVar, iVar2 = Abc_ObjFaninNum((Abc_Obj_t *)vNodes_local), iVar1 < iVar2;
      iVar = iVar + 1) {
    pNode1 = Abc_ObjFanin((Abc_Obj_t *)vNodes_local,iVar);
    _nNodesDsd = Dsd_ManagerReadInput(pDStack_20,iVar);
    Dsd_NodeSetMark(_nNodesDsd,(int)pNode1);
  }
  pNodeDsd = (Dsd_Node_t *)Dsd_TreeCollectNodesDfsOne(pDStack_20,pFaninDsd,&fCompl);
  for (iVar = 0; iVar < fCompl; iVar = iVar + 1) {
    pFanin = Abc_NtkDsdConstructNode
                       (pDStack_20,*(Dsd_Node_t **)(&pNodeDsd->Type + (long)iVar * 2),
                        *(Abc_Ntk_t **)vNodes_local,(int *)dd);
    iVar1 = Abc_NodeIsForDsd(pFanin);
    if ((iVar1 != 0) && (pCounters_local._4_4_ != 0)) {
      Vec_PtrPush((Vec_Ptr_t *)pManDsd_local,pFanin);
    }
  }
  if (pNodeDsd != (Dsd_Node_t *)0x0) {
    free(pNodeDsd);
    pNodeDsd = (Dsd_Node_t *)0x0;
  }
  if (pFanin != (Abc_Obj_t *)0x0) {
    Abc_ObjRemoveFanins((Abc_Obj_t *)vNodes_local);
    Abc_ObjAddFanin((Abc_Obj_t *)vNodes_local,pFanin);
    Cudd_RecursiveDeref((DdManager *)pRoot,(DdNode *)vNodes_local[3].pArray);
    vNodes_local[3].pArray = (void **)(*pRoot[4].field_5.pData ^ (long)(int)((uint)pDVar3 & 1));
    Cudd_Ref((DdNode *)vNodes_local[3].pArray);
    return;
  }
  __assert_fail("pRoot",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDsd.c"
                ,0x1b0,
                "void Abc_NodeDecompDsdAndMux(Abc_Obj_t *, Vec_Ptr_t *, Dsd_Manager_t *, int, int *)"
               );
}

Assistant:

void Abc_NodeDecompDsdAndMux( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes, Dsd_Manager_t * pManDsd, int fRecursive, int * pCounters )
{
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    Abc_Obj_t * pRoot = NULL, * pFanin, * pNode1, * pNode2, * pNodeC;
    Dsd_Node_t ** ppNodesDsd, * pNodeDsd, * pFaninDsd;
    int i, nNodesDsd, iVar, fCompl;

    // try disjoint support decomposition
    pNodeDsd = Dsd_DecomposeOne( pManDsd, (DdNode *)pNode->pData );
    fCompl   = Dsd_IsComplement( pNodeDsd );
    pNodeDsd = Dsd_Regular( pNodeDsd );

    // determine what decomposition to use   
    if ( !fRecursive || Dsd_NodeReadDecsNum(pNodeDsd) != Abc_ObjFaninNum(pNode) )
    { // perform DSD

        // set the inputs
        Abc_ObjForEachFanin( pNode, pFanin, i )
        {
            pFaninDsd = Dsd_ManagerReadInput( pManDsd, i );
            Dsd_NodeSetMark( pFaninDsd, (int)(ABC_PTRINT_T)pFanin );
        }

        // construct the intermediate nodes
        ppNodesDsd = Dsd_TreeCollectNodesDfsOne( pManDsd, pNodeDsd, &nNodesDsd );
        for ( i = 0; i < nNodesDsd; i++ )
        {
            pRoot = Abc_NtkDsdConstructNode( pManDsd, ppNodesDsd[i], pNode->pNtk, pCounters );
            if ( Abc_NodeIsForDsd(pRoot) && fRecursive )
                Vec_PtrPush( vNodes, pRoot );
        }
        ABC_FREE( ppNodesDsd );
        assert(pRoot);

        // remove the current fanins
        Abc_ObjRemoveFanins( pNode );
        // add fanin to the root
        Abc_ObjAddFanin( pNode, pRoot );
        // update the function to be that of buffer
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = Cudd_NotCond( (DdNode *)dd->vars[0], fCompl ); Cudd_Ref( (DdNode *)pNode->pData );
    }
    else // perform MUX-decomposition
    {
        // get the cofactoring variable
        iVar = Abc_NodeFindMuxVar( dd, (DdNode *)pNode->pData, Abc_ObjFaninNum(pNode) );
        pNodeC = Abc_ObjFanin( pNode, iVar );

        // get the negative cofactor
        pNode1 = Abc_NtkCloneObj( pNode );
        pNode1->pData = Cudd_Cofactor( dd, (DdNode *)pNode->pData, Cudd_Not(dd->vars[iVar]) );  Cudd_Ref( (DdNode *)pNode1->pData );
        Abc_NodeMinimumBase( pNode1 );
        if ( Abc_NodeIsForDsd(pNode1) )
            Vec_PtrPush( vNodes, pNode1 );

        // get the positive cofactor
        pNode2 = Abc_NtkCloneObj( pNode );
        pNode2->pData = Cudd_Cofactor( dd, (DdNode *)pNode->pData, dd->vars[iVar] );            Cudd_Ref( (DdNode *)pNode2->pData );
        Abc_NodeMinimumBase( pNode2 );
        if ( Abc_NodeIsForDsd(pNode2) )
            Vec_PtrPush( vNodes, pNode2 );

        // remove the current fanins
        Abc_ObjRemoveFanins( pNode );
        // add new fanins
        Abc_ObjAddFanin( pNode, pNodeC );
        Abc_ObjAddFanin( pNode, pNode2 );
        Abc_ObjAddFanin( pNode, pNode1 );
        // update the function to be that of MUX
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pData );
        pNode->pData = Cudd_bddIte( dd, dd->vars[0], dd->vars[1], dd->vars[2] );    Cudd_Ref( (DdNode *)pNode->pData );
    }
}